

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

int array_container_rank(array_container_t *arr,uint16_t x)

{
  ushort uVar1;
  bool bVar2;
  uint in_EAX;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  iVar3 = arr->cardinality + -1;
  uVar5 = 0;
  do {
    if (iVar3 < (int)uVar5) {
      uVar4 = ~uVar5;
      break;
    }
    uVar4 = uVar5 + iVar3 >> 1;
    uVar1 = *(ushort *)((long)arr->array + (ulong)(uVar5 + iVar3 & 0xfffffffe));
    if (uVar1 < x) {
      uVar5 = uVar4 + 1;
      bVar2 = true;
      uVar4 = in_EAX;
    }
    else if (x < uVar1) {
      iVar3 = uVar4 - 1;
      bVar2 = true;
      uVar4 = in_EAX;
    }
    else {
      bVar2 = false;
    }
    in_EAX = uVar4;
  } while (bVar2);
  uVar5 = ~uVar4;
  if (-1 < (int)uVar4) {
    uVar5 = uVar4 + 1;
  }
  return uVar5;
}

Assistant:

inline int array_container_rank(const array_container_t *arr, uint16_t x) {
    const int32_t idx = binarySearch(arr->array, arr->cardinality, x);
    const bool is_present = idx >= 0;
    if (is_present) {
        return idx + 1;
    } else {
        return -idx - 1;
    }
}